

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O1

int __thiscall
FFlatVertexBuffer::CreateVertices
          (FFlatVertexBuffer *this,int h,sector_t *sec,secplane_t *plane,int floor)

{
  extsector_t *peVar1;
  sector_t *psVar2;
  extsector_t *peVar3;
  int iVar4;
  F3DFloor *pFVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  sec->vboheight[h] = sec->planes[h].TexZ;
  iVar4 = CreateSectorVertices(this,sec,plane,floor);
  sec->vboindex[h] = iVar4;
  peVar1 = sec->e;
  if ((peVar1->FakeFloor).Sectors.Count != 0) {
    uVar8 = 0;
    do {
      psVar2 = (peVar1->FakeFloor).Sectors.Array[uVar8];
      iVar4 = CreateSectorVertices(this,psVar2,plane,0);
      psVar2->vboindex[h + 2] = iVar4;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (peVar1->FakeFloor).Sectors.Count);
  }
  peVar1 = sec->e;
  if ((peVar1->XFloor).attached.Count != 0) {
    uVar8 = 0;
    do {
      psVar2 = (peVar1->XFloor).attached.Array[uVar8];
      peVar3 = psVar2->e;
      uVar6 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          pFVar5 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar7];
          if (pFVar5->model == sec) goto LAB_00373757;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      pFVar5 = (F3DFloor *)0x0;
LAB_00373757:
      if ((pFVar5 != (F3DFloor *)0x0) && ((pFVar5->flags & 8) != 0)) {
        if ((pFVar5->top).model == sec) {
          bVar9 = (pFVar5->top).isceiling == h;
        }
        else {
          bVar9 = false;
        }
        if ((pFVar5->bottom).model == sec) {
          bVar10 = (pFVar5->bottom).isceiling == h;
        }
        else {
          bVar10 = false;
        }
        if ((bool)(bVar9 | bVar10)) {
          if (bVar9) {
            (pFVar5->top).vindex = (this->vbo_shadowdata).Count;
          }
          if (bVar10) {
            (pFVar5->bottom).vindex = (this->vbo_shadowdata).Count;
          }
          CreateSectorVertices(this,psVar2,plane,0);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (peVar1->XFloor).attached.Count);
  }
  sec->vbocount[h] = (this->vbo_shadowdata).Count - sec->vboindex[h];
  return sec->vboindex[h];
}

Assistant:

int FFlatVertexBuffer::CreateVertices(int h, sector_t *sec, const secplane_t &plane, int floor)
{
	// First calculate the vertices for the sector itself
	sec->vboheight[h] = sec->GetPlaneTexZ(h);
	sec->vboindex[h] = CreateSectorVertices(sec, plane, floor);

	// Next are all sectors using this one as heightsec
	TArray<sector_t *> &fakes = sec->e->FakeFloor.Sectors;
	for (unsigned g=0; g<fakes.Size(); g++)
	{
		sector_t *fsec = fakes[g];
		fsec->vboindex[2+h] = CreateSectorVertices(fsec, plane, false);
	}

	// and finally all attached 3D floors
	TArray<sector_t *> &xf = sec->e->XFloor.attached;
	for (unsigned g=0; g<xf.Size(); g++)
	{
		sector_t *fsec = xf[g];
		F3DFloor *ffloor = Find3DFloor(fsec, sec);

		if (ffloor != NULL && ffloor->flags & FF_RENDERPLANES)
		{
			bool dotop = (ffloor->top.model == sec) && (ffloor->top.isceiling == h);
			bool dobottom = (ffloor->bottom.model == sec) && (ffloor->bottom.isceiling == h);

			if (dotop || dobottom)
			{
				if (dotop) ffloor->top.vindex = vbo_shadowdata.Size();
				if (dobottom) ffloor->bottom.vindex = vbo_shadowdata.Size();
	
				CreateSectorVertices(fsec, plane, false);
			}
		}
	}
	sec->vbocount[h] = vbo_shadowdata.Size() - sec->vboindex[h];
	return sec->vboindex[h];
}